

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AggregateType::AggregateType
          (AggregateType *this,KUINT8 Kind,KUINT8 Domain,KUINT8 Country,KUINT8 Categoy,
          KUINT8 SubCategory,KUINT8 Specific,KUINT8 Extra)

{
  KUINT8 SubCategory_local;
  KUINT8 Categoy_local;
  KUINT8 Country_local;
  KUINT8 Domain_local;
  KUINT8 Kind_local;
  AggregateType *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__AggregateType_00331338;
  this->m_ui8Kind = Kind;
  this->m_ui8Domain = Domain;
  this->m_ui16Country = (ushort)Country;
  this->m_ui8Category = Categoy;
  this->m_ui8SubCategory = SubCategory;
  this->m_ui8Specific = Specific;
  this->m_ui8Extra = Extra;
  return;
}

Assistant:

AggregateType::AggregateType( KUINT8 Kind, KUINT8  Domain, KUINT8 Country, KUINT8  Categoy,
                              KUINT8  SubCategory, KUINT8  Specific, KUINT8  Extra ) :
    m_ui8Kind( Kind ),
    m_ui8Domain( Domain ),
    m_ui16Country( Country ),
    m_ui8Category( Categoy ),
    m_ui8SubCategory( SubCategory ),
    m_ui8Specific( Specific ),
    m_ui8Extra( Extra )
{
}